

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxFastRT<double>::maxDelta(SPxFastRT<double> *this,int *nr,double *max,double *maxabs)

{
  int iVar1;
  int iVar2;
  SPxSolverBase<double> *this_00;
  undefined8 in_RCX;
  int *in_RSI;
  long in_RDI;
  int indp;
  int indc;
  VectorBase<double> *in_stack_000000d8;
  VectorBase<double> *in_stack_000000e0;
  UpdateVector<double> *in_stack_000000e8;
  double *in_stack_000000f0;
  double *in_stack_000000f8;
  SPxFastRT<double> *in_stack_00000100;
  int in_stack_00000110;
  int in_stack_00000118;
  int i;
  undefined8 local_8;
  
  i = (int)((ulong)in_RCX >> 0x20);
  *(undefined1 *)(in_RDI + 0x50) = 1;
  this_00 = (SPxSolverBase<double> *)
            SPxSolverBase<double>::coPvec(*(SPxSolverBase<double> **)(in_RDI + 8));
  SPxSolverBase<double>::lcBound(*(SPxSolverBase<double> **)(in_RDI + 8));
  SPxSolverBase<double>::ucBound(*(SPxSolverBase<double> **)(in_RDI + 8));
  iVar1 = maxDelta(in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,
                   in_stack_000000e0,in_stack_000000d8,in_stack_00000110,in_stack_00000118);
  *(undefined1 *)(in_RDI + 0x50) = 0;
  SPxSolverBase<double>::pVec(*(SPxSolverBase<double> **)(in_RDI + 8));
  SPxSolverBase<double>::lpBound(*(SPxSolverBase<double> **)(in_RDI + 8));
  SPxSolverBase<double>::upBound(*(SPxSolverBase<double> **)(in_RDI + 8));
  iVar2 = maxDelta(in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,
                   in_stack_000000e0,in_stack_000000d8,in_stack_00000110,in_stack_00000118);
  if (iVar2 < 0) {
    if (iVar1 < 0) {
      *in_RSI = -1;
      SPxId::SPxId((SPxId *)0x2bcd06);
    }
    else {
      *in_RSI = iVar1;
      local_8 = (DataKey)SPxSolverBase<double>::coId(this_00,i);
    }
  }
  else {
    *in_RSI = iVar2;
    local_8 = (DataKey)SPxSolverBase<double>::id(this_00,i);
  }
  return (SPxId)local_8;
}

Assistant:

SPxId SPxFastRT<R>::maxDelta(
   int& nr,
   R& max,                                /* on return: maximum step length */
   R& maxabs)                             /* on return: maximum absolute value in delta VectorBase<R> */
{
   /* The following cause side effects on coPvec and pVec - both changes may be needed later in
      maxSelect(). We can therefore not move the first function after the (indp >= 0) check. */
   iscoid = true;
   int indc = maxDelta(max, maxabs,
                       this->thesolver->coPvec(), this->thesolver->lcBound(), this->thesolver->ucBound(), 0, 1);
   iscoid = false;
   int indp = maxDelta(max, maxabs,
                       this->thesolver->pVec(), this->thesolver->lpBound(), this->thesolver->upBound(), 0, 1);

   if(indp >= 0)
   {
      nr = indp;
      return this->thesolver->id(indp);
   }

   if(indc >= 0)
   {
      nr = indc;
      return this->thesolver->coId(indc);
   }

   nr = -1;
   return SPxId();
}